

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

int8_t icu_63::compareUnicodeString(UElement t1,UElement t2)

{
  int8_t iVar1;
  UnicodeString *b;
  UnicodeString *a;
  UElement t2_local;
  UElement t1_local;
  
  iVar1 = UnicodeString::compare((UnicodeString *)t1.pointer,(UnicodeString *)t2.pointer);
  return iVar1;
}

Assistant:

static int8_t U_CALLCONV compareUnicodeString(UElement t1, UElement t2) {
    const UnicodeString &a = *(const UnicodeString*)t1.pointer;
    const UnicodeString &b = *(const UnicodeString*)t2.pointer;
    return a.compare(b);
}